

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_nex.cpp
# Opt level: O0

void dirNexPaletteBmp(void)

{
  bool bVar1;
  uint uVar2;
  int __oflag;
  undefined1 local_70 [8];
  SBmpFile bmp;
  fullpath_ref_t bmpIn;
  
  bmp._88_8_ = GetInputFile(&lp);
  bVar1 = std::filesystem::__cxx11::path::empty((path *)bmp._88_8_);
  if ((bVar1) || (bVar1 = comma(&lp), bVar1)) {
    Error("[SAVENEX] expected syntax is BMP <filename>",bp,SUPPRESS);
  }
  else {
    SBmpFile::SBmpFile((SBmpFile *)local_70);
    uVar2 = SBmpFile::open((SBmpFile *)local_70,(char *)bmp._88_8_,__oflag);
    if ((uVar2 & 1) != 0) {
      dirNexPaletteBmp((SBmpFile *)local_70);
    }
    SBmpFile::~SBmpFile((SBmpFile *)local_70);
  }
  return;
}

Assistant:

static void dirNexPaletteBmp() {
// ;; SAVENEX PALETTE BMP <filename>
	fullpath_ref_t bmpIn = GetInputFile(lp);
	if (bmpIn.full.empty() || comma(lp)) {
		Error("[SAVENEX] expected syntax is BMP <filename>", bp, SUPPRESS);
		return;
	}
	// try to open the actual BMP file
	SBmpFile bmp;
	if (!bmp.open(bmpIn)) return;
	// check the palette if it was requested from this bmp and process it
	dirNexPaletteBmp(bmp);
}